

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::saveHistory(Cmd *this)

{
  pointer pbVar1;
  ostream *poVar2;
  string *entry;
  pointer pbVar3;
  ofstream file;
  
  if ((this->history_file_).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::ofstream::ofstream((ostream *)&file,(string *)&this->history_file_,_S_out);
    pbVar1 = (this->history_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (this->history_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      poVar2 = std::operator<<((ostream *)&file,(string *)pbVar3);
      std::operator<<(poVar2,'\n');
    }
    std::ofstream::~ofstream(&file);
  }
  return;
}

Assistant:

void saveHistory() {
		if (history_file_) {
			std::ofstream file(*history_file_);
			for (const std::string &entry : history_) {
				file << entry << '\n';
			}
		}
	}